

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O2

void __thiscall jsonChildren::shrink(jsonChildren *this)

{
  json_index_t jVar1;
  allocator local_31;
  json_string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Children is null shrink",&local_31);
  JSONDebug::_JSON_ASSERT(true,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  jVar1 = this->mysize;
  if (jVar1 == 0) {
    libjson_free<JSONNode*>(&this->array);
    this->array = (JSONNode **)0x0;
    jVar1 = this->mysize;
  }
  this->mycapacity = jVar1;
  return;
}

Assistant:

inline childrenVirtual void shrink() json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null shrink"));
	   if (json_unlikely(mysize == 0)){  //size is zero, we should completely free the array
		  libjson_free<JSONNode*>(array);  //free does checks for a null pointer, so don't bother checking
		  array = 0;
	   #ifdef JSON_LESS_MEMORY
		  } else {  //need to shrink it, using realloc
			 JSON_ASSERT(array != 0, JSON_TEXT("shrinking a null array that is not size 0"));
			 array = json_realloc<JSONNode*>(array, mysize);
	   #endif
	   }
	   mycapacity = mysize;
    }